

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O3

int list_txt_files(char *dir_path,char ***file_names)

{
  int iVar1;
  DIR *__dirp;
  char **ppcVar2;
  dirent *pdVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  __dirp = opendir(dir_path);
  if (__dirp == (DIR *)0x0) {
    *file_names = (char **)0x0;
  }
  else {
    ppcVar2 = (char **)malloc(8);
    *file_names = ppcVar2;
    if (ppcVar2 != (char **)0x0) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) {
        iVar6 = 0;
LAB_00104e92:
        closedir(__dirp);
        return iVar6;
      }
      iVar6 = 0;
LAB_00104df6:
      pcVar4 = strrchr(pdVar3->d_name,0x2e);
      if ((pcVar4 == (char *)0x0) || (iVar1 = strcmp(pcVar4,".txt"), iVar1 != 0)) goto LAB_00104e63;
      lVar7 = (long)iVar6;
      ppcVar2 = (char **)realloc(*file_names,lVar7 * 8 + 8);
      if (ppcVar2 == (char **)0x0) {
        ppcVar2 = *file_names;
        if (ppcVar2 != (char **)0x0) {
          if (0 < iVar6) {
            lVar5 = 0;
            do {
              free(ppcVar2[lVar5]);
              lVar5 = lVar5 + 1;
            } while (lVar7 != lVar5);
          }
          free(ppcVar2);
        }
        *file_names = (char **)0x0;
        return -1;
      }
      *file_names = ppcVar2;
      pcVar4 = strdup(pdVar3->d_name);
      ppcVar2[lVar7] = pcVar4;
      if (pcVar4 != (char *)0x0) {
        iVar6 = iVar6 + 1;
        goto LAB_00104e63;
      }
      if (0 < iVar6) {
        lVar5 = 0;
        do {
          free(ppcVar2[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar7 != lVar5);
      }
      free(ppcVar2);
      *file_names = (char **)0x0;
    }
    closedir(__dirp);
  }
  return -1;
LAB_00104e63:
  pdVar3 = readdir(__dirp);
  if (pdVar3 == (dirent *)0x0) goto LAB_00104e92;
  goto LAB_00104df6;
}

Assistant:

int list_txt_files(const char *dir_path, char ***file_names) {
    #ifdef __unix__
        return __list_txt_files__unix(dir_path, file_names);
    #endif
    #ifdef _WIN32
        return __list_txt_files__win(dir_path, file_names);
    #endif
    return -1;
}